

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O3

void __thiscall
StunMsgCxx_RFC5769SampleIPv4Response_Test::~StunMsgCxx_RFC5769SampleIPv4Response_Test
          (StunMsgCxx_RFC5769SampleIPv4Response_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StunMsgCxx, RFC5769SampleIPv4Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x3c, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x08, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x01,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0xe1,0x12,0xa6,0x43, //    Xor'd mapped IPv4 address
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x2b,0x91,0xf5,0x99, // }
    0xfd,0x9e,0x90,0xc3, // }
    0x8c,0x74,0x89,0xf9, // }  HMAC-SHA1 fingerprint
    0x2a,0xf9,0xba,0x53, // }
    0xf0,0x6b,0xe7,0xd7, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc0,0x7d,0x4c,0x96, //    CRC32 fingerprint
  };

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in ipv4;
  ipv4.sin_family = AF_INET;
  ipv4.sin_port = htons(32853);
  inet_pton(AF_INET, "192.0.2.1", &ipv4.sin_addr);

  stun::message message(stun::message::binding_response, tsx_id);
  message << stun::attribute::software(software_name, ' ')
          << stun::attribute::xor_mapped_address(ipv4)
          << stun::attribute::message_integrity(password)
          << stun::attribute::fingerprint();
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_response, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::software, i->type());
  ASSERT_EQ(software_name,
    i->to<type::software>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::xor_mapped_address, i->type());
  sockaddr_in test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_TRUE(
    i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET, test_addr.sin_family);
  EXPECT_EQ(htons(32853), test_addr.sin_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin_addr, &ipv4.sin_addr,
      sizeof(ipv4.sin_addr)));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(password));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::fingerprint, i->type());
  EXPECT_TRUE(
    i->to<type::fingerprint>().check_integrity());

  ASSERT_TRUE(message.end() == ++i);
}